

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_lookup_ext *
vm_lookup_ext::expand_ext(CVmObjLookupTable *self,vm_lookup_ext *old_ext,uint new_value_cnt)

{
  vm_lookup_ext *pvVar1;
  CVmVarHeap *pCVar2;
  uint in_EDX;
  CVmObjLookupTable *in_RSI;
  vm_lookup_ext *new_ext;
  vm_lookup_ext *in_stack_00000028;
  vm_lookup_ext *in_stack_00000030;
  uint in_stack_ffffffffffffffe8;
  
  pvVar1 = alloc_ext(in_RSI,in_EDX,in_stack_ffffffffffffffe8);
  copy_ext_from(in_stack_00000030,in_stack_00000028);
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  (*pCVar2->_vptr_CVmVarHeap[6])(pCVar2,in_RSI);
  return pvVar1;
}

Assistant:

vm_lookup_ext *vm_lookup_ext::expand_ext(VMG_ CVmObjLookupTable *self,
                                         vm_lookup_ext *old_ext,
                                         uint new_value_cnt)
{
    vm_lookup_ext *new_ext;

    /* allocate a new extension structure of the requested size */
    new_ext = alloc_ext(vmg_ self, old_ext->bucket_cnt, new_value_cnt);

    /* copy the old extension data into the new extension */
    new_ext->copy_ext_from(old_ext);

    /* delete the old memory */
    G_mem->get_var_heap()->free_mem(old_ext);

    /* return the new extension */
    return new_ext;
}